

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

Subprocess * __thiscall phosg::Subprocess::operator=(Subprocess *this,Subprocess *other)

{
  this->stdin_write_fd = other->stdin_write_fd;
  this->stdout_read_fd = other->stdout_read_fd;
  this->stderr_read_fd = other->stderr_read_fd;
  this->child_pid = other->child_pid;
  this->terminated = other->terminated;
  this->exit_status = other->exit_status;
  other->stdin_write_fd = -1;
  other->stdout_read_fd = -1;
  other->stderr_read_fd = -1;
  other->child_pid = -1;
  return this;
}

Assistant:

Subprocess& Subprocess::operator=(Subprocess&& other) {
  this->stdin_write_fd = other.stdin_write_fd;
  this->stdout_read_fd = other.stdout_read_fd;
  this->stderr_read_fd = other.stderr_read_fd;
  this->child_pid = other.child_pid;
  this->terminated = other.terminated;
  this->exit_status = other.exit_status;
  other.stdin_write_fd = -1;
  other.stdout_read_fd = -1;
  other.stderr_read_fd = -1;
  other.child_pid = -1;
  return *this;
}